

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

string * __thiscall Tokens::current_abi_cxx11_(Tokens *this)

{
  pointer pbVar1;
  string *psVar2;
  
  pbVar1 = (this->fTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->fIndex <
      (ulong)((long)(this->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    return pbVar1 + this->fIndex;
  }
  psVar2 = (string *)CONCAT71(0x1527,current[abi:cxx11]()::empty_abi_cxx11_);
  if (current[abi:cxx11]()::empty_abi_cxx11_ != '\0') {
    return &current[abi:cxx11]()::empty_abi_cxx11_;
  }
  current_abi_cxx11_();
  return psVar2;
}

Assistant:

explicit operator bool() const {
		return fIndex < fTokens.size();
	}